

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::GetCustomCommandTarget
          (cmMakefile *this,string *target,cmObjectLibraryCommands objLibCommands,
          cmListFileBacktrace *lfbt)

{
  cmake *pcVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  iterator iVar5;
  ostream *poVar6;
  PolicyID id;
  MessageType t;
  char *pcVar7;
  cmTarget *pcVar8;
  string local_1c0;
  ostringstream e;
  
  iVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->Targets)._M_h,target);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    PVar4 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0040,false);
    if (PVar4 - NEW < 3) {
      t = FATAL_ERROR;
    }
    else {
      if (PVar4 != WARN) goto LAB_00244cd5;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)&DAT_00000028,id);
      poVar6 = std::operator<<((ostream *)&e,(string *)&local_1c0);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&local_1c0);
      t = AUTHOR_WARNING;
    }
    pcVar8 = FindTargetToUse(this,target,false);
    if (pcVar8 == (cmTarget *)0x0) {
      poVar6 = std::operator<<((ostream *)&e,"No TARGET \'");
      poVar6 = std::operator<<(poVar6,(string *)target);
      pcVar7 = "\' has been created in this directory.";
    }
    else {
      bVar2 = cmTarget::IsImported(pcVar8);
      if (bVar2) {
        poVar6 = std::operator<<((ostream *)&e,"TARGET \'");
        poVar6 = std::operator<<(poVar6,(string *)target);
        pcVar7 = "\' is IMPORTED and does not build here.";
      }
      else {
        poVar6 = std::operator<<((ostream *)&e,"TARGET \'");
        poVar6 = std::operator<<(poVar6,(string *)target);
        pcVar7 = "\' was not created in this directory.";
      }
    }
    std::operator<<(poVar6,pcVar7);
    pcVar1 = this->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(pcVar1,t,&local_1c0,lfbt);
  }
  else {
    pcVar8 = (cmTarget *)
             ((long)iVar5.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                    ._M_cur + 0x28);
    if ((objLibCommands == Reject) && (TVar3 = cmTarget::GetType(pcVar8), TVar3 == OBJECT_LIBRARY))
    {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar6 = std::operator<<((ostream *)&e,"Target \"");
      poVar6 = std::operator<<(poVar6,(string *)target);
      std::operator<<(poVar6,
                      "\" is an OBJECT library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                     );
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_1c0,lfbt);
    }
    else {
      TVar3 = cmTarget::GetType(pcVar8);
      if (TVar3 != INTERFACE_LIBRARY) {
        return pcVar8;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar6 = std::operator<<((ostream *)&e,"Target \"");
      poVar6 = std::operator<<(poVar6,(string *)target);
      std::operator<<(poVar6,
                      "\" is an INTERFACE library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                     );
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_1c0,lfbt);
    }
  }
  std::__cxx11::string::~string((string *)&local_1c0);
LAB_00244cd5:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return (cmTarget *)0x0;
}

Assistant:

cmTarget* cmMakefile::GetCustomCommandTarget(
  const std::string& target, cmObjectLibraryCommands objLibCommands,
  const cmListFileBacktrace& lfbt) const
{
  // Find the target to which to add the custom command.
  auto ti = this->Targets.find(target);

  if (ti == this->Targets.end()) {
    MessageType messageType = MessageType::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch (this->GetPolicyStatus(cmPolicies::CMP0040)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0040) << "\n";
        issueMessage = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      if (cmTarget const* t = this->FindTargetToUse(target)) {
        if (t->IsImported()) {
          e << "TARGET '" << target
            << "' is IMPORTED and does not build here.";
        } else {
          e << "TARGET '" << target << "' was not created in this directory.";
        }
      } else {
        e << "No TARGET '" << target
          << "' has been created in this directory.";
      }
      this->GetCMakeInstance()->IssueMessage(messageType, e.str(), lfbt);
    }

    return nullptr;
  }

  cmTarget* t = &ti->second;
  if (objLibCommands == cmObjectLibraryCommands::Reject &&
      t->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an OBJECT library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           lfbt);
    return nullptr;
  }
  if (t->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an INTERFACE library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           lfbt);
    return nullptr;
  }

  return t;
}